

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O3

void __thiscall QPDF::dumpLinearizationDataInternal(QPDF *this)

{
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  element_type *this_00;
  string *str;
  Pipeline *pPVar2;
  QPDFLogger local_20;
  
  QPDFLogger::getInfo(&local_20,
                      SUB81(*(undefined8 *)
                             &((this->m)._M_t.
                               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                               .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->log,0))
  ;
  this_00 = local_20.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  str = (string *)
        (**(code **)(**(long **)&(((this->m)._M_t.
                                   super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                   .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                                 file).super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> +
                    0x18))();
  pPVar2 = Pipeline::operator<<((Pipeline *)this_00,str);
  Pipeline::operator<<(pPVar2,": linearization data:\n\n");
  if (local_20.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  QPDFLogger::getInfo(&local_20,
                      SUB81(*(undefined8 *)
                             &((this->m)._M_t.
                               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                               .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->log,0))
  ;
  pPVar2 = Pipeline::operator<<
                     ((Pipeline *)
                      local_20.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,"file_size: ");
  pPVar2 = Pipeline::operator<<
                     (pPVar2,(((this->m)._M_t.
                               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                               .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->linp).
                             file_size);
  pPVar2 = Pipeline::operator<<(pPVar2,"\n");
  pPVar2 = Pipeline::operator<<(pPVar2,"first_page_object: ");
  pPVar2 = Pipeline::operator<<
                     (pPVar2,*(int *)((long)&((this->m)._M_t.
                                              super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                              .super__Head_base<0UL,_QPDF::Members_*,_false>.
                                             _M_head_impl)->linp + 8));
  pPVar2 = Pipeline::operator<<(pPVar2,"\n");
  pPVar2 = Pipeline::operator<<(pPVar2,"first_page_end: ");
  pPVar2 = Pipeline::operator<<
                     (pPVar2,*(qpdf_offset_t *)
                              ((long)&((this->m)._M_t.
                                       super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                       .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)
                                      ->linp + 0x10));
  pPVar2 = Pipeline::operator<<(pPVar2,"\n");
  pPVar2 = Pipeline::operator<<(pPVar2,"npages: ");
  pPVar2 = Pipeline::operator<<
                     (pPVar2,*(int *)((long)&((this->m)._M_t.
                                              super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                              .super__Head_base<0UL,_QPDF::Members_*,_false>.
                                             _M_head_impl)->linp + 0x18));
  pPVar2 = Pipeline::operator<<(pPVar2,"\n");
  pPVar2 = Pipeline::operator<<(pPVar2,"xref_zero_offset: ");
  pPVar2 = Pipeline::operator<<
                     (pPVar2,*(qpdf_offset_t *)
                              ((long)&((this->m)._M_t.
                                       super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                       .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)
                                      ->linp + 0x20));
  pPVar2 = Pipeline::operator<<(pPVar2,"\n");
  pPVar2 = Pipeline::operator<<(pPVar2,"first_page: ");
  pPVar2 = Pipeline::operator<<
                     (pPVar2,*(int *)((long)&((this->m)._M_t.
                                              super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                              .super__Head_base<0UL,_QPDF::Members_*,_false>.
                                             _M_head_impl)->linp + 0x28));
  pPVar2 = Pipeline::operator<<(pPVar2,"\n");
  pPVar2 = Pipeline::operator<<(pPVar2,"H_offset: ");
  pPVar2 = Pipeline::operator<<
                     (pPVar2,*(qpdf_offset_t *)
                              ((long)&((this->m)._M_t.
                                       super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                       .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)
                                      ->linp + 0x30));
  pPVar2 = Pipeline::operator<<(pPVar2,"\n");
  pPVar2 = Pipeline::operator<<(pPVar2,"H_length: ");
  pPVar2 = Pipeline::operator<<
                     (pPVar2,*(qpdf_offset_t *)
                              ((long)&((this->m)._M_t.
                                       super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                       .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)
                                      ->linp + 0x38));
  pPVar2 = Pipeline::operator<<(pPVar2,"\n");
  Pipeline::operator<<(pPVar2,"\n");
  if (local_20.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  QPDFLogger::getInfo(&local_20,
                      SUB81(*(undefined8 *)
                             &((this->m)._M_t.
                               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                               .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->log,0))
  ;
  Pipeline::operator<<
            ((Pipeline *)
             local_20.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             "Page Offsets Hint Table\n\n");
  if (local_20.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  dumpHPageOffset(this);
  QPDFLogger::getInfo(&local_20,
                      SUB81(*(undefined8 *)
                             &((this->m)._M_t.
                               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                               .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->log,0))
  ;
  Pipeline::operator<<
            ((Pipeline *)
             local_20.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             "\nShared Objects Hint Table\n\n");
  if (local_20.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  dumpHSharedObject(this);
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  if (0 < *(int *)((long)&(_Var1._M_head_impl)->outline_hints + 0x10)) {
    QPDFLogger::getInfo(&local_20,SUB81(*(undefined8 *)&(_Var1._M_head_impl)->log,0));
    Pipeline::operator<<
              ((Pipeline *)
               local_20.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               ,"\nOutlines Hint Table\n\n");
    if (local_20.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_20.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    dumpHGeneric(this,&((this->m)._M_t.
                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->outline_hints)
    ;
  }
  return;
}

Assistant:

void
QPDF::dumpLinearizationDataInternal()
{
    *m->log->getInfo() << m->file->getName() << ": linearization data:\n\n";

    *m->log->getInfo() << "file_size: " << m->linp.file_size << "\n"
                       << "first_page_object: " << m->linp.first_page_object << "\n"
                       << "first_page_end: " << m->linp.first_page_end << "\n"
                       << "npages: " << m->linp.npages << "\n"
                       << "xref_zero_offset: " << m->linp.xref_zero_offset << "\n"
                       << "first_page: " << m->linp.first_page << "\n"
                       << "H_offset: " << m->linp.H_offset << "\n"
                       << "H_length: " << m->linp.H_length << "\n"
                       << "\n";

    *m->log->getInfo() << "Page Offsets Hint Table\n\n";
    dumpHPageOffset();
    *m->log->getInfo() << "\nShared Objects Hint Table\n\n";
    dumpHSharedObject();

    if (m->outline_hints.nobjects > 0) {
        *m->log->getInfo() << "\nOutlines Hint Table\n\n";
        dumpHGeneric(m->outline_hints);
    }
}